

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible
          (CopyPropagateArrays *this,Instruction *var_inst,Instruction *store_inst)

{
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  uVar1;
  bool bVar2;
  Instruction *in_RCX;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source;
  
  if (store_inst->opcode_ != OpVariable) {
    __assert_fail("var_inst->opcode() == spv::Op::OpVariable && \"Expecting a variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x76,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible(Instruction *, Instruction *)"
                 );
  }
  if ((in_RCX != (Instruction *)0x0) &&
     (bVar2 = HasValidReferencesOnly((CopyPropagateArrays *)var_inst,store_inst,in_RCX), bVar2)) {
    Instruction::GetSingleWordInOperand(in_RCX,1);
    GetSourceObjectIfAny((CopyPropagateArrays *)&source,(uint32_t)var_inst);
    uVar1 = source;
    if (((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          )source._M_t.
           super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
           _M_head_impl ==
         (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          )0x0) ||
       (bVar2 = HasNoStores((CopyPropagateArrays *)var_inst,
                            *(Instruction **)
                             source._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                             ._M_head_impl), !bVar2)) {
      (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
    }
    else {
      (this->super_MemPass).super_Pass._vptr_Pass =
           (_func_int **)
           uVar1._M_t.
           super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
           _M_head_impl;
      source._M_t.
      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
      .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>._M_head_impl
           = (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )(__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                )0x0;
    }
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
    ::~unique_ptr(&source);
    return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )this;
  }
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::FindSourceObjectIfPossible(Instruction* var_inst,
                                                Instruction* store_inst) {
  assert(var_inst->opcode() == spv::Op::OpVariable && "Expecting a variable.");

  // Check that the variable is a composite object where |store_inst|
  // dominates all of its loads.
  if (!store_inst) {
    return nullptr;
  }

  // Look at the loads to ensure they are dominated by the store.
  if (!HasValidReferencesOnly(var_inst, store_inst)) {
    return nullptr;
  }

  // If so, look at the store to see if it is the copy of an object.
  std::unique_ptr<MemoryObject> source = GetSourceObjectIfAny(
      store_inst->GetSingleWordInOperand(kStoreObjectInOperand));

  if (!source) {
    return nullptr;
  }

  // Ensure that |source| does not change between the point at which it is
  // loaded, and the position in which |var_inst| is loaded.
  //
  // For now we will go with the easy to implement approach, and check that the
  // entire variable (not just the specific component) is never written to.

  if (!HasNoStores(source->GetVariable())) {
    return nullptr;
  }
  return source;
}